

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  grasshopper_w128_t *target;
  byte bVar1;
  uint uVar2;
  long lVar3;
  grasshopper_w128_t *source;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  grasshopper_w128_t tmp;
  grasshopper_w128_t *local_68;
  grasshopper_w128_t local_40;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  uVar2 = EVP_CIPHER_CTX_get_num(ctx);
  target = (grasshopper_w128_t *)(lVar3 + 0x198);
  sVar5 = inl;
  while( true ) {
    if ((uVar2 == 0) || (sVar5 == 0)) break;
    bVar1 = *in;
    in = in + 1;
    *out = target->b[uVar2] ^ bVar1;
    out = out + 1;
    uVar2 = uVar2 + 1 & 0xf;
    sVar5 = sVar5 - 1;
  }
  EVP_CIPHER_CTX_set_num(ctx,uVar2);
  uVar4 = sVar5 >> 4;
  local_68 = (grasshopper_w128_t *)in;
  while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar3 + 0x48),source,target,
               (grasshopper_w128_t *)(lVar3 + 0x188));
    grasshopper_plus128(&local_40,target,local_68);
    grasshopper_copy128((grasshopper_w128_t *)out,&local_40);
    ctr128_inc(source->b);
    local_68 = local_68 + 1;
    out = (uchar *)((long)out + 0x10);
    sVar5 = sVar5 - 0x10;
  }
  if (sVar5 != 0) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar3 + 0x48),source,target,
               (grasshopper_w128_t *)(lVar3 + 0x188));
    for (uVar4 = 0; uVar4 < sVar5; uVar4 = uVar4 + 1) {
      out[uVar4] = local_68->b[uVar4] ^ target->b[uVar4];
    }
    EVP_CIPHER_CTX_set_num(ctx);
    ctr128_inc(source->b);
  }
  return (int)inl;
}

Assistant:

static int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = (gost_grasshopper_cipher_ctx_ctr *)
        EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    grasshopper_w128_t *currentInputBlock;
    grasshopper_w128_t *currentOutputBlock;
    unsigned int n = EVP_CIPHER_CTX_num(ctx);
    size_t lasted = inl;
    size_t i;
    size_t blocks;
    grasshopper_w128_t *iv_buffer;
    grasshopper_w128_t tmp;

    while (n && lasted) {
        *(current_out++) = *(current_in++) ^ c->partial_buffer.b[n];
        --lasted;
        n = (n + 1) % GRASSHOPPER_BLOCK_SIZE;
    }
    EVP_CIPHER_CTX_set_num(ctx, n);
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    iv_buffer = (grasshopper_w128_t *) iv;

    // full parts
    for (i = 0; i < blocks; i++) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer, currentInputBlock);
        grasshopper_copy128(currentOutputBlock, &tmp);
        ctr128_inc(iv_buffer->b);
        current_in += GRASSHOPPER_BLOCK_SIZE;
        current_out += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    if (lasted > 0) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++) {
            currentOutputBlock->b[i] =
                c->partial_buffer.b[i] ^ currentInputBlock->b[i];
        }
        EVP_CIPHER_CTX_set_num(ctx, i);
        ctr128_inc(iv_buffer->b);
    }

    return inl;
}